

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoRecognizeMuxes(Gia_Man_t *pGia)

{
  int *piVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Gia_Obj_t *pNode;
  long lVar8;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (0 < pGia->nObjs) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pNode = (Gia_Obj_t *)(&pGia->pObjs->field_0x0 + lVar8);
      if (((~*(uint *)pNode & 0x1fffffff) != 0 && -1 < (int)*(uint *)pNode) &&
         (iVar2 = Gia_ObjIsMuxType(pNode), iVar2 != 0)) {
        pGVar3 = Gia_ObjRecognizeMux(pNode,&local_38,&local_40);
        uVar5 = (ulong)local_40 & 0xfffffffffffffffe;
        uVar6 = (ulong)local_38 & 0xfffffffffffffffe;
        if (uVar5 == uVar6) {
          piVar1 = (int *)(((ulong)pNode & 0xfffffffffffffffe) + 8);
          *piVar1 = *piVar1 + 0x1239a9d5;
          iVar2 = 0x673ba5de;
          uVar4 = (ulong)pGVar3 & 0xfffffffffffffffe;
          uVar6 = uVar5;
        }
        else {
          piVar1 = (int *)(((ulong)pNode & 0xfffffffffffffffe) + 8);
          *piVar1 = *piVar1 + -0x50b50ff9;
          piVar1 = (int *)(((ulong)pGVar3 & 0xfffffffffffffffe) + 8);
          *piVar1 = *piVar1 + 0x44203b19;
          iVar2 = 0x2399d955;
          uVar4 = uVar5;
        }
        *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + iVar2;
        *(int *)(uVar6 + 8) = *(int *)(uVar6 + 8) + iVar2;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar7 < pGia->nObjs);
  }
  return;
}

Assistant:

void Gia_IsoRecognizeMuxes( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj, * pObjC, * pObj1, * pObj0;
    int i;
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pObjC = Gia_ObjRecognizeMux( pObj, &pObj1, &pObj0 );
        if ( Gia_Regular(pObj0) == Gia_Regular(pObj1) )
        {
            // this is XOR
            Gia_Regular(pObj)->Value += s_256Primes[233];
            Gia_Regular(pObjC)->Value += s_256Primes[234];
            Gia_Regular(pObj0)->Value += s_256Primes[234];
        }
        else
        {
            // this is MUX
            Gia_Regular(pObj)->Value += s_256Primes[235];
            Gia_Regular(pObjC)->Value += s_256Primes[236];
            Gia_Regular(pObj0)->Value += s_256Primes[237];
            Gia_Regular(pObj1)->Value += s_256Primes[237];
        }
    }
}